

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_4,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 *puVar1;
  int col;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  float v;
  float fVar5;
  undefined8 local_98;
  float afStack_90 [2];
  undefined8 local_88;
  Vector<float,_4> res;
  int aiStack_60 [6];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  res.m_data._8_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  puVar1 = &local_48;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  puVar2 = &DAT_0224bb00;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  local_98 = 0;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  puVar1 = &local_48;
  lVar3 = 0;
  do {
    fVar5 = 0.0;
    lVar4 = 0;
    do {
      fVar5 = fVar5 + *(float *)((long)puVar1 + lVar4 * 4) * res.m_data[lVar4 + 2];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    *(float *)((long)&local_98 + lVar3 * 4) = fVar5;
    lVar3 = lVar3 + 1;
    puVar1 = puVar1 + 2;
  } while (lVar3 != 4);
  local_88 = local_98;
  res.m_data[0] = afStack_90[0] + afStack_90[1];
  aiStack_60[2] = 0;
  aiStack_60[3] = 1;
  aiStack_60[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_60[lVar3]] = afStack_90[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}